

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  fmtflags __fmtfl;
  ostream *this;
  void *pvVar2;
  fmtflags flags;
  wchar_t w_c;
  ostream *os_local;
  uchar c_local;
  
  switch((uint)c) {
  case 0:
    std::operator<<(os,"\\0");
    break;
  default:
    bVar1 = IsPrintableAscii((uint)c);
    if (!bVar1) {
      __fmtfl = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
      this = std::operator<<(os,"\\x");
      pvVar2 = (void *)std::ostream::operator<<(this,std::hex);
      pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::uppercase);
      std::ostream::operator<<(pvVar2,(uint)c);
      std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)),__fmtfl);
      return kHexEscape;
    }
    std::operator<<(os,c);
    return kAsIs;
  case 7:
    std::operator<<(os,"\\a");
    break;
  case 8:
    std::operator<<(os,"\\b");
    break;
  case 9:
    std::operator<<(os,"\\t");
    break;
  case 10:
    std::operator<<(os,"\\n");
    break;
  case 0xb:
    std::operator<<(os,"\\v");
    break;
  case 0xc:
    std::operator<<(os,"\\f");
    break;
  case 0xd:
    std::operator<<(os,"\\r");
    break;
  case 0x27:
    std::operator<<(os,"\\\'");
    break;
  case 0x5c:
    std::operator<<(os,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  wchar_t w_c = static_cast<wchar_t>(c);
  switch (w_c) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(w_c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        ostream::fmtflags flags = os->flags();
        *os << "\\x" << std::hex << std::uppercase
            << static_cast<int>(static_cast<UnsignedChar>(c));
        os->flags(flags);
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}